

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_util.hpp
# Opt level: O2

size_t __thiscall
mserialize::detail::size_between_balanced(detail *this,string_view s,char open,char close)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = s._ptr;
  pcVar2 = (char *)0x1;
  pcVar3 = pcVar2;
  do {
    if (pcVar1 <= pcVar2) {
      return (size_t)(pcVar1 + (pcVar1 == (char *)0x0));
    }
    if (this[(long)pcVar2] == s._len._0_1_) {
      pcVar3 = pcVar3 + 1;
    }
    else if ((this[(long)pcVar2] == (detail)open) && (pcVar3 = pcVar3 + -1, pcVar3 == (char *)0x0))
    {
      return (size_t)(pcVar2 + 1);
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

inline std::size_t size_between_balanced(string_view s, char open, char close)
{
  std::size_t open_count = 1;
  std::size_t i = 1;

  for (; i < s.size(); ++i)
  {
    if (s[i] == open)
    {
      ++open_count;
    }
    else if (s[i] == close)
    {
      --open_count;
      if (open_count == 0) { ++i; break; }
    }
  }

  return i;
}